

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VConstVectorArray_Serial(int nvec,realtype c,N_Vector *Z)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < nvec) {
    if (nvec == 1) {
      N_VConst_Serial(c,*Z);
    }
    else {
      uVar1 = *(*Z)->content;
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar3 = 0; uVar3 != (uint)nvec; uVar3 = uVar3 + 1) {
        lVar2 = *(long *)((long)Z[uVar3]->content + 8);
        for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
          *(realtype *)(lVar2 + uVar4 * 8) = c;
        }
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VConstVectorArray_Serial(int nvec, realtype c, N_Vector* Z)
{
  int          i;
  sunindextype j, N;
  realtype*    zd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VConst */
  if (nvec == 1) {
    N_VConst_Serial(c, Z[0]);
    return(0);
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* set each vector in the vector array to a constant */
  for (i=0; i<nvec; i++) {
    zd = NV_DATA_S(Z[i]);
    for (j=0; j<N; j++) {
      zd[j] = c;
    }
  }

  return(0);
}